

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O2

void __thiscall
TasGrid::TasmanianSparseGrid::makeLocalPolynomialGrid
          (TasmanianSparseGrid *this,int dimensions,int outputs,int depth,int order,
          TypeOneDRule rule,vector<int,_std::allocator<int>_> *level_limits)

{
  pointer piVar1;
  pointer piVar2;
  BaseCanonicalGrid *pBVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  invalid_argument *piVar6;
  TypeOneDRule rule_local;
  int order_local;
  int depth_local;
  int outputs_local;
  int dimensions_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string message;
  string local_40;
  
  rule_local = rule;
  order_local = order;
  depth_local = depth;
  outputs_local = outputs;
  dimensions_local = dimensions;
  if (dimensions < 1) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar6,"ERROR: makeLocalPolynomialGrid() requires positive dimensions");
  }
  else if (outputs < 0) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar6,"ERROR: makeLocalPolynomialGrid() requires non-negative outputs");
  }
  else if (depth < 0) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar6,"ERROR: makeLocalPolynomialGrid() requires non-negative depth");
  }
  else {
    if (order < -1) {
      ::std::__cxx11::to_string(&local_40,order);
      ::std::operator+(&local_80,"ERROR: makeLocalPolynomialGrid() is called with order: ",&local_40
                      );
      ::std::operator+(&message,&local_80,", but the order cannot be less than -1.");
      ::std::__cxx11::string::~string((string *)&local_80);
      ::std::__cxx11::string::~string((string *)&local_40);
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      ::std::invalid_argument::invalid_argument(piVar6,(string *)&message);
      __cxa_throw(piVar6,&::std::invalid_argument::typeinfo,
                  ::std::invalid_argument::~invalid_argument);
    }
    bVar5 = OneDimensionalMeta::isLocalPolynomial(rule);
    if (!bVar5) {
      IO::getRuleString_abi_cxx11_(rule_local);
      ::std::operator+(&local_80,"ERROR: makeLocalPolynomialGrid() is called with rule: ",&local_40)
      ;
      ::std::operator+(&message,&local_80,", which is not a local polynomial rule");
      ::std::__cxx11::string::~string((string *)&local_80);
      ::std::__cxx11::string::~string((string *)&local_40);
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      ::std::invalid_argument::invalid_argument(piVar6,(string *)&message);
      __cxa_throw(piVar6,&::std::invalid_argument::typeinfo,
                  ::std::invalid_argument::~invalid_argument);
    }
    piVar1 = (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((piVar1 == piVar2) || ((long)piVar2 - (long)piVar1 >> 2 == (ulong)(uint)dimensions)) {
      clear(this);
      ::std::vector<int,_std::allocator<int>_>::operator=(&this->llimits,level_limits);
      local_80._M_dataplus._M_p =
           (pointer)(this->acceleration)._M_t.
                    super___uniq_ptr_impl<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_TasGrid::AccelerationContext_*,_std::default_delete<TasGrid::AccelerationContext>_>
                    .super__Head_base<0UL,_TasGrid::AccelerationContext_*,_false>._M_head_impl;
      Utils::
      make_unique<TasGrid::GridLocalPolynomial,TasGrid::AccelerationContext*,int&,int&,int&,int&,TasGrid::TypeOneDRule&,std::vector<int,std::allocator<int>>&>
                ((Utils *)&message,(AccelerationContext **)&local_80,&dimensions_local,
                 &outputs_local,&depth_local,&order_local,&rule_local,&this->llimits);
      _Var4 = message._M_dataplus;
      message._M_dataplus._M_p = (pointer)0x0;
      pBVar3 = (this->base)._M_t.
               super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
               .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
      (this->base)._M_t.
      super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
      ._M_t.
      super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
      .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl =
           (BaseCanonicalGrid *)_Var4._M_p;
      if (pBVar3 != (BaseCanonicalGrid *)0x0) {
        (*pBVar3->_vptr_BaseCanonicalGrid[1])();
        if (message._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)message._M_dataplus._M_p + 8))();
        }
      }
      return;
    }
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar6,
               "ERROR: makeLocalPolynomialGrid() requires level_limits with either 0 or dimensions entries"
              );
  }
  __cxa_throw(piVar6,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
}

Assistant:

void TasmanianSparseGrid::makeLocalPolynomialGrid(int dimensions, int outputs, int depth, int order, TypeOneDRule rule, const std::vector<int> &level_limits){
    if (dimensions < 1) throw std::invalid_argument("ERROR: makeLocalPolynomialGrid() requires positive dimensions");
    if (outputs < 0) throw std::invalid_argument("ERROR: makeLocalPolynomialGrid() requires non-negative outputs");
    if (depth < 0) throw std::invalid_argument("ERROR: makeLocalPolynomialGrid() requires non-negative depth");
    if (order < -1){
        std::string message = "ERROR: makeLocalPolynomialGrid() is called with order: " + std::to_string(order) + ", but the order cannot be less than -1.";
        throw std::invalid_argument(message);
    }
    if (!OneDimensionalMeta::isLocalPolynomial(rule)){
        std::string message = "ERROR: makeLocalPolynomialGrid() is called with rule: " + IO::getRuleString(rule) + ", which is not a local polynomial rule";
        throw std::invalid_argument(message);
    }
    if ((!level_limits.empty()) && (level_limits.size() != (size_t) dimensions)) throw std::invalid_argument("ERROR: makeLocalPolynomialGrid() requires level_limits with either 0 or dimensions entries");
    clear();
    llimits = level_limits;
    base = Utils::make_unique<GridLocalPolynomial>(acceleration.get(), dimensions, outputs, depth, order, rule, llimits);
}